

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

bool TerminalSupportsColor(void)

{
  int iVar1;
  char *__s1;
  char *term;
  bool term_supports_color;
  
  term._7_1_ = false;
  __s1 = getenv("TERM");
  if ((__s1 != (char *)0x0) && (*__s1 != '\0')) {
    iVar1 = strcmp(__s1,"xterm");
    term._7_1_ = true;
    if (iVar1 != 0) {
      iVar1 = strcmp(__s1,"xterm-color");
      term._7_1_ = true;
      if (iVar1 != 0) {
        iVar1 = strcmp(__s1,"xterm-256color");
        term._7_1_ = true;
        if (iVar1 != 0) {
          iVar1 = strcmp(__s1,"screen-256color");
          term._7_1_ = true;
          if (iVar1 != 0) {
            iVar1 = strcmp(__s1,"konsole");
            term._7_1_ = true;
            if (iVar1 != 0) {
              iVar1 = strcmp(__s1,"konsole-16color");
              term._7_1_ = true;
              if (iVar1 != 0) {
                iVar1 = strcmp(__s1,"konsole-256color");
                term._7_1_ = true;
                if (iVar1 != 0) {
                  iVar1 = strcmp(__s1,"screen");
                  term._7_1_ = true;
                  if (iVar1 != 0) {
                    iVar1 = strcmp(__s1,"linux");
                    term._7_1_ = true;
                    if (iVar1 != 0) {
                      iVar1 = strcmp(__s1,"cygwin");
                      term._7_1_ = iVar1 == 0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return term._7_1_;
}

Assistant:

static bool TerminalSupportsColor() {
  bool term_supports_color = false;
#ifdef OS_WINDOWS
  // on Windows TERM variable is usually not set, but the console does
  // support colors.
  term_supports_color = true;
#else
  // On non-Windows platforms, we rely on the TERM variable.
  const char* const term = getenv("TERM");
  if (term != NULL && term[0] != '\0') {
    term_supports_color =
      !strcmp(term, "xterm") ||
      !strcmp(term, "xterm-color") ||
      !strcmp(term, "xterm-256color") ||
      !strcmp(term, "screen-256color") ||
      !strcmp(term, "konsole") ||
      !strcmp(term, "konsole-16color") ||
      !strcmp(term, "konsole-256color") ||
      !strcmp(term, "screen") ||
      !strcmp(term, "linux") ||
      !strcmp(term, "cygwin");
  }
#endif
  return term_supports_color;
}